

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

wchar_t parsedigit(char c)

{
  wchar_t wVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,c);
  if ((byte)(c - 0x30U) < 10) {
    return iVar2 + L'\xffffffd0';
  }
  if ((byte)(c + 0x9fU) < 6) {
    return iVar2 + L'\xffffff9f';
  }
  wVar1 = L'\xffffffff';
  if ((byte)(c + 0xbfU) < 6) {
    wVar1 = iVar2 + L'\xffffffbf';
  }
  return wVar1;
}

Assistant:

static int
parsedigit(char c)
{
	if (c >= '0' && c <= '9')
		return c - '0';
	else if (c >= 'a' && c <= 'f')
		return c - 'a';
	else if (c >= 'A' && c <= 'F')
		return c - 'A';
	else
		return -1;
}